

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::Expression> __thiscall minja::Parser::parseLogicalAnd(Parser *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  runtime_error *prVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  element_type *in_RDI;
  shared_ptr<minja::Expression> sVar6;
  shared_ptr<minja::Expression> right;
  Location location;
  shared_ptr<minja::Expression> *left;
  shared_ptr<minja::BinaryOpExpr> *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  element_type *this_00;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  flag_type in_stack_ffffffffffffff84;
  Location *in_stack_ffffffffffffff88;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffff90;
  Parser *in_stack_ffffffffffffff98;
  string local_60 [56];
  undefined4 in_stack_ffffffffffffffd8;
  SpaceHandling in_stack_ffffffffffffffdc;
  regex *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar7;
  
  uVar7 = 0;
  this_00 = in_RDI;
  parseLogicalNot((Parser *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this_00);
  if (!bVar1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Expected left side of \'logical and\' expression");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (parseLogicalAnd()::and_tok_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&parseLogicalAnd()::and_tok_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff84);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseLogicalAnd()::and_tok_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseLogicalAnd()::and_tok_abi_cxx11_);
    }
  }
  get_location(in_stack_ffffffffffffff98);
  while( true ) {
    consumeToken((Parser *)CONCAT17(uVar7,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
                 in_stack_ffffffffffffffdc);
    bVar2 = std::__cxx11::string::empty();
    bVar2 = bVar2 ^ 0xff;
    std::__cxx11::string::~string(local_60);
    if ((bVar2 & 1) == 0) {
      bVar2 = 1;
      Location::~Location((Location *)0x2f64ce);
      _Var5._M_pi = extraout_RDX;
      if ((bVar2 & 1) == 0) {
        std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2f64f0);
        _Var5._M_pi = extraout_RDX_00;
      }
      sVar6.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var5._M_pi;
      sVar6.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<minja::Expression>)
             sVar6.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
    }
    parseLogicalNot((Parser *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffff90);
    if (!bVar1) break;
    std::
    make_shared<minja::BinaryOpExpr,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,minja::BinaryOpExpr::Op>
              (in_stack_ffffffffffffff88,
               (shared_ptr<minja::Expression> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (shared_ptr<minja::Expression> *)CONCAT44(0xe,in_stack_ffffffffffffff78),
               (Op *)this_00);
    std::shared_ptr<minja::Expression>::operator=
              ((shared_ptr<minja::Expression> *)CONCAT17(bVar2,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    std::shared_ptr<minja::BinaryOpExpr>::~shared_ptr((shared_ptr<minja::BinaryOpExpr> *)0x2f64a1);
    std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2f64ab);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"Expected right side of \'and\' expression");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Expression> parseLogicalAnd() {
        auto left = parseLogicalNot();
        if (!left) throw std::runtime_error("Expected left side of 'logical and' expression");

        static std::regex and_tok(R"(and\b)");
        auto location = get_location();
        while (!consumeToken(and_tok).empty()) {
            auto right = parseLogicalNot();
            if (!right) throw std::runtime_error("Expected right side of 'and' expression");
            left = std::make_shared<BinaryOpExpr>(location, std::move(left), std::move(right), BinaryOpExpr::Op::And);
        }
        return left;
    }